

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

bool __thiscall
soul::SourceCodeModel::rebuild
          (SourceCodeModel *this,CompileMessageList *errors,
          ArrayView<soul::RefCountedPtr<soul::SourceCodeText>_> filesToLoad)

{
  Type TVar1;
  File *pFVar2;
  pointer pCVar3;
  pointer pCVar4;
  SourceCodeText *pSVar5;
  SourceCodeText *o;
  pointer pcVar6;
  string_view firstReplacement;
  undefined8 uVar7;
  pointer ppVar8;
  bool bVar9;
  Namespace *parentNamespace;
  long *plVar10;
  pointer pCVar11;
  RefCountedPtr<soul::SourceCodeText> *pRVar12;
  Comment *summary;
  Comment *extraout_RDX;
  Comment *extraout_RDX_00;
  Comment *summary_00;
  File *this_00;
  pointer ppVar13;
  ulong uVar14;
  File *pFVar15;
  long in_FS_OFFSET;
  byte bVar16;
  string_view name;
  CompileMessageHandler handler;
  Allocator allocator;
  undefined1 in_stack_fffffffffffffe38 [15];
  undefined1 local_1b8 [24];
  long lStack_1a0;
  RefCountedPtr<soul::SourceCodeText> *local_198;
  ulong local_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  Ptr local_168;
  UTF8Reader local_160;
  Ptr local_158;
  UTF8Reader local_150;
  SourceCodeModel *local_140;
  Ptr local_138;
  Ptr local_130;
  size_type local_128;
  CompileMessageList *local_120;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  local_118;
  long *local_100 [2];
  long local_f0 [2];
  ulong local_e0;
  string *local_d8;
  CodeLocation local_d0;
  string local_c0;
  CodeLocation local_a0;
  Allocator local_90;
  
  pRVar12 = filesToLoad.s;
  pFVar15 = (this->files).
            super__Vector_base<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (this->files).
           super__Vector_base<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pFVar15;
  local_140 = this;
  local_120 = errors;
  if (pFVar2 != pFVar15) {
    do {
      File::~File(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pFVar2);
    (local_140->files).
    super__Vector_base<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>.
    _M_impl.super__Vector_impl_data._M_finish = pFVar15;
  }
  PoolAllocator::PoolAllocator(&local_90.pool);
  local_90.identifiers.strings.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.identifiers.strings.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.identifiers.strings.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.stringDictionary.super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__StringDictionary_002d3a30;
  local_90.stringDictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.stringDictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.stringDictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.stringDictionary.nextIndex = 1;
  parentNamespace = AST::createRootNamespace(&local_90);
  local_128 = (long)filesToLoad.e - (long)pRVar12 >> 3;
  std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>::resize
            (&local_140->files,local_128);
  bVar16 = filesToLoad.e == pRVar12;
  if (!(bool)bVar16) {
    local_e0 = local_128 + (local_128 == 0);
    uVar14 = 0;
    local_198 = pRVar12;
    do {
      pFVar15 = (local_140->files).
                super__Vector_base<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar14;
      local_178._8_8_ =
           std::
           _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
           ::_M_invoke;
      local_188._0_8_ = local_120;
      local_188._8_8_ = (pointer)0x0;
      local_178._0_8_ =
           std::
           _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
           ::_M_manager;
      local_168.object = *(SourceCodeText **)(in_FS_OFFSET + -8);
      *(Comment **)(in_FS_OFFSET + -8) = (Comment *)local_188;
      local_130.object = local_198[uVar14].object;
      if (local_130.object != (SourceCodeText *)0x0) {
        ((local_130.object)->super_RefCountedObject).refCount =
             ((local_130.object)->super_RefCountedObject).refCount + 1;
      }
      local_190 = uVar14;
      CodeLocation::CodeLocation(&local_d0,&local_130);
      Compiler::parseTopLevelDeclarations(&local_118,&local_90,&local_d0,parentNamespace);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_d0.sourceCode.object);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_130.object);
      ppVar8 = local_118.
               super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar13 = local_118.
                     super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar8;
          ppVar13 = ppVar13 + 1) {
        do {
          bVar9 = ASTUtilities::mergeFirstPairOfDuplicateNamespaces(parentNamespace);
        } while (bVar9);
        recurseFindingModules(ppVar13->object,pFVar15,&local_90.stringDictionary);
      }
      if (local_118.
          super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.
                        super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.
                              super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.
                              super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      CompileMessageHandler::~CompileMessageHandler((CompileMessageHandler *)local_188);
      pCVar3 = (local_120->messages).
               super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pCVar4 = (local_120->messages).
               super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      bVar9 = pCVar3 != pCVar4;
      if (bVar9) {
        TVar1 = pCVar3->type;
        while ((TVar1 & ~internalCompilerError) != error) {
          pCVar11 = pCVar3 + 1;
          bVar9 = pCVar11 != pCVar4;
          if (pCVar11 == pCVar4) break;
          TVar1 = pCVar3[1].type;
          pCVar3 = pCVar11;
        }
      }
      if (bVar9) break;
      pSVar5 = local_198[local_190].object;
      if (pSVar5 != (SourceCodeText *)0x0) {
        (pSVar5->super_RefCountedObject).refCount = (pSVar5->super_RefCountedObject).refCount + 1;
      }
      o = (pFVar15->source).object;
      (pFVar15->source).object = pSVar5;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
      if (local_198[local_190].object == (SourceCodeText *)0x0) {
        throwInternalCompilerError("object != nullptr","operator->",0x47);
      }
      local_d8 = &pFVar15->filename;
      std::__cxx11::string::_M_assign((string *)local_d8);
      local_100[0] = local_f0;
      pcVar6 = (pFVar15->filename)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_100,pcVar6,pcVar6 + (pFVar15->filename)._M_string_length);
      firstReplacement._M_str._7_1_ = bVar16;
      firstReplacement._0_15_ = in_stack_fffffffffffffe38;
      choc::text::replace<std::__cxx11::string>
                (&local_c0,(text *)local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5,
                 (string_view)ZEXT816(0x262e06),firstReplacement);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x262df1);
      local_1b8._0_8_ = local_1b8 + 0x10;
      name._M_str = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == name._M_str) {
        local_1b8._16_8_ = ((name._M_str)->_M_dataplus)._M_p;
        lStack_1a0 = plVar10[3];
      }
      else {
        local_1b8._16_8_ = ((name._M_str)->_M_dataplus)._M_p;
        local_1b8._0_8_ = (pointer)*plVar10;
      }
      local_1b8._8_8_ = plVar10[1];
      *plVar10 = (long)name._M_str;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      name._M_len = local_1b8._0_8_;
      makeUID_abi_cxx11_((string *)local_188,(soul *)local_1b8._8_8_,name);
      std::__cxx11::string::operator=((string *)&pFVar15->UID,(string *)local_188);
      if ((CompileMessageList *)local_188._0_8_ != (CompileMessageList *)local_178) {
        operator_delete((void *)local_188._0_8_,(ulong)(local_178._0_8_ + 1));
      }
      if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_1b8._16_8_)->_M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (local_100[0] != local_f0) {
        operator_delete(local_100[0],local_f0[0] + 1);
      }
      local_138.object = local_198[local_190].object;
      if (local_138.object != (SourceCodeText *)0x0) {
        ((local_138.object)->super_RefCountedObject).refCount =
             ((local_138.object)->super_RefCountedObject).refCount + 1;
      }
      CodeLocation::CodeLocation(&local_a0,&local_138);
      SourceCodeUtilities::getFileSummaryComment((Comment *)local_188,&local_a0);
      uVar7 = local_188._0_8_;
      (pFVar15->fileComment).valid = (bool)local_188[0];
      (pFVar15->fileComment).isStarSlash = (bool)local_188[1];
      (pFVar15->fileComment).isDoxygenStyle = (bool)local_188[2];
      (pFVar15->fileComment).isReferringBackwards = (bool)local_188[3];
      local_1b8._0_8_ =
           (pFVar15->fileComment).lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1b8._8_8_ =
           (pFVar15->fileComment).lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_1b8._16_8_ =
           (pFVar15->fileComment).lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pFVar15->fileComment).lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_188._8_8_;
      (pFVar15->fileComment).lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_178._0_8_;
      (pFVar15->fileComment).lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_178._8_8_;
      local_188._8_8_ = (pointer)0x0;
      local_178._0_8_ = (pointer)0x0;
      local_178._8_8_ = (pointer)0x0;
      local_188._0_8_ = uVar7;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b8);
      pSVar5 = (pFVar15->fileComment).range.start.sourceCode.object;
      if (local_168.object != pSVar5) {
        (pFVar15->fileComment).range.start.sourceCode.object = local_168.object;
        local_168.object = (SourceCodeText *)0x0;
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar5);
      }
      (pFVar15->fileComment).range.start.location.data = local_160.data;
      pSVar5 = (pFVar15->fileComment).range.end.sourceCode.object;
      if (local_158.object != pSVar5) {
        (pFVar15->fileComment).range.end.sourceCode.object = local_158.object;
        local_158.object = (SourceCodeText *)0x0;
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar5);
      }
      (pFVar15->fileComment).range.end.location.data = local_150.data;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_158.object);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_168.object);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_188 + 8));
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a0.sourceCode.object);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_138.object);
      SourceCodeUtilities::getFileSummaryTitle_abi_cxx11_
                ((string *)local_188,(SourceCodeUtilities *)&pFVar15->fileComment,summary);
      std::__cxx11::string::operator=((string *)&pFVar15->title,(string *)local_188);
      summary_00 = extraout_RDX;
      if ((CompileMessageList *)local_188._0_8_ != (CompileMessageList *)local_178) {
        operator_delete((void *)local_188._0_8_,(ulong)(local_178._0_8_ + 1));
        summary_00 = extraout_RDX_00;
      }
      SourceCodeUtilities::getFileSummaryBody_abi_cxx11_
                ((string *)local_188,(SourceCodeUtilities *)&pFVar15->fileComment,summary_00);
      std::__cxx11::string::operator=((string *)&pFVar15->summary,(string *)local_188);
      if ((CompileMessageList *)local_188._0_8_ != (CompileMessageList *)local_178) {
        operator_delete((void *)local_188._0_8_,(ulong)(local_178._0_8_ + 1));
      }
      if ((pFVar15->title)._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&pFVar15->title);
      }
      uVar14 = local_190 + 1;
      bVar16 = local_128 <= uVar14;
    } while (uVar14 != local_e0);
  }
  local_90.stringDictionary.super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__StringDictionary_002d3a30;
  std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::~vector
            (&local_90.stringDictionary.strings);
  std::
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_90.identifiers.strings);
  std::
  vector<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
  ::~vector((vector<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
             *)&local_90);
  return (bool)(bVar16 & 1);
}

Assistant:

bool SourceCodeModel::rebuild (CompileMessageList& errors, ArrayView<SourceCodeText::Ptr> filesToLoad)
{
    files.clear();
    AST::Allocator allocator;
    auto& topLevelNamespace = AST::createRootNamespace (allocator);

    files.resize (filesToLoad.size());

    for (size_t i = 0; i < filesToLoad.size(); ++i)
    {
        auto& f = filesToLoad[i];
        auto& desc = files[i];

        try
        {
            CompileMessageHandler handler (errors);

            for (auto& m : Compiler::parseTopLevelDeclarations (allocator, f, topLevelNamespace))
            {
                ASTUtilities::mergeDuplicateNamespaces (topLevelNamespace);
                recurseFindingModules (m, desc, allocator.stringDictionary);
            }
        }
        catch (AbortCompilationException) {}

        if (errors.hasErrors())
            return false;

        desc.source = f;
        desc.filename = f->filename;
        desc.UID = makeUID ("lib_" + choc::text::replace (desc.filename, ".soul", ""));
        desc.fileComment = SourceCodeUtilities::getFileSummaryComment (f);
        desc.title = SourceCodeUtilities::getFileSummaryTitle (desc.fileComment);
        desc.summary = SourceCodeUtilities::getFileSummaryBody (desc.fileComment);

        if (desc.title.empty())
            desc.title = desc.filename;
    }

    return true;
}